

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

float ncnn::reduction(float v0,float *ptr,int size,int op_type)

{
  ulong uVar1;
  ulong uVar2;
  float fVar3;
  float local_28;
  
  switch(op_type) {
  case 0:
    uVar2 = 0;
    uVar1 = (ulong)(uint)size;
    if (size < 1) {
      uVar1 = uVar2;
    }
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      v0 = v0 + ptr[uVar2];
    }
    break;
  case 1:
    uVar2 = 0;
    uVar1 = (ulong)(uint)size;
    if (size < 1) {
      uVar1 = uVar2;
    }
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      v0 = v0 + ABS(ptr[uVar2]);
    }
    break;
  case 2:
    uVar2 = 0;
    uVar1 = (ulong)(uint)size;
    if (size < 1) {
      uVar1 = uVar2;
    }
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      v0 = v0 + ptr[uVar2] * ptr[uVar2];
    }
    break;
  case 3:
  case 7:
  case 8:
  case 9:
    break;
  case 4:
    uVar2 = 0;
    uVar1 = (ulong)(uint)size;
    if (size < 1) {
      uVar1 = uVar2;
    }
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      if (v0 <= ptr[uVar2]) {
        v0 = ptr[uVar2];
      }
    }
    break;
  case 5:
    uVar2 = 0;
    uVar1 = (ulong)(uint)size;
    if (size < 1) {
      uVar1 = uVar2;
    }
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      if (ptr[uVar2] <= v0) {
        v0 = ptr[uVar2];
      }
    }
    break;
  case 6:
    uVar2 = 0;
    uVar1 = (ulong)(uint)size;
    if (size < 1) {
      uVar1 = uVar2;
    }
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      v0 = v0 * ptr[uVar2];
    }
    break;
  case 10:
    uVar2 = 0;
    uVar1 = (ulong)(uint)size;
    local_28 = v0;
    if (size < 1) {
      uVar1 = uVar2;
    }
    for (; v0 = local_28, uVar1 != uVar2; uVar2 = uVar2 + 1) {
      fVar3 = expf(ptr[uVar2]);
      local_28 = local_28 + fVar3;
    }
    break;
  default:
    goto switchD_002fbf9a_default;
  }
switchD_002fbf9a_default:
  return v0;
}

Assistant:

static float reduction(float v0, const float* ptr, int size, int op_type)
{
    if (op_type == Reduction::ReductionOp_SUM) return reduction<reduction_op_add>(v0, ptr, size);
    if (op_type == Reduction::ReductionOp_ASUM) return reduction<reduction_op_asum>(v0, ptr, size);
    if (op_type == Reduction::ReductionOp_SUMSQ) return reduction<reduction_op_sumsq>(v0, ptr, size);
    if (op_type == Reduction::ReductionOp_PROD) return reduction<reduction_op_mul>(v0, ptr, size);
    if (op_type == Reduction::ReductionOp_MAX) return reduction<reduction_op_max>(v0, ptr, size);
    if (op_type == Reduction::ReductionOp_MIN) return reduction<reduction_op_min>(v0, ptr, size);
    if (op_type == Reduction::ReductionOp_LogSumExp) return reduction<reduction_op_sumexp>(v0, ptr, size);

    // should never reach here
    return v0;
}